

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O3

void aux_rawset(lua_State *L,int idx,TValue *key,int n)

{
  Table *t;
  TValue *pTVar1;
  StkId pSVar2;
  
  pTVar1 = index2value(L,idx);
  t = (Table *)(pTVar1->value_).gc;
  luaH_set(L,t,key,(TValue *)((L->top).offset + -0x10));
  t->flags = t->flags & 0xc0;
  pSVar2 = (L->top).p;
  if ((((undefined1  [16])((undefined1  [16])*pSVar2 & (undefined1  [16])0x40) !=
        (undefined1  [16])0x0) && ((t->marked & 0x20) != 0)) &&
     (((pSVar2[-1].val.value_.gc)->marked & 0x18) != 0)) {
    luaC_barrierback_(L,(GCObject *)t);
    pSVar2 = (L->top).p;
  }
  (L->top).p = pSVar2 + -(ulong)(uint)n;
  return;
}

Assistant:

static void aux_rawset (lua_State *L, int idx, TValue *key, int n) {
  Table *t;
  lua_lock(L);
  api_checknelems(L, n);
  t = gettable(L, idx);
  luaH_set(L, t, key, s2v(L->top.p - 1));
  invalidateTMcache(t);
  luaC_barrierback(L, obj2gco(t), s2v(L->top.p - 1));
  L->top.p -= n;
  lua_unlock(L);
}